

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLinOp::solutionResidual
          (MLNodeLinOp *this,int amrlev,MultiFab *resid,MultiFab *x,MultiFab *b,MultiFab *param_6)

{
  bool bVar1;
  MFIter *in_RDI;
  FabArrayBase *in_R8;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *dd;
  Array4<const_double> *bb;
  Array4<double> *res;
  Box *bx;
  MFIter mfi;
  iMultiFab *dmsk;
  int ncomp;
  int mglev;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffcac;
  MFIter *mfi_00;
  MultiFab *in_stack_fffffffffffffcb8;
  FabArray<amrex::FArrayBox> *this_00;
  MultiFab *in_stack_fffffffffffffcc0;
  long *plVar3;
  undefined8 in_stack_fffffffffffffcc8;
  long *plVar4;
  MLNodeLinOp *in_stack_fffffffffffffcd0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffcd8;
  MLMGBndry *in_stack_fffffffffffffce8;
  int local_310;
  int local_30c;
  BATType local_308;
  int local_304;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  long local_2c0 [8];
  long *local_280;
  long local_278 [8];
  long *local_238;
  long local_230 [8];
  long *local_1f0;
  undefined1 local_1e4 [132];
  type local_160;
  int local_158;
  undefined4 local_154;
  int local_120 [2];
  BATType local_118;
  FabArray<amrex::FArrayBox> *local_110;
  int local_104;
  int iStack_100;
  BATType local_fc;
  undefined8 local_f8;
  int local_f0;
  FabArray<amrex::FArrayBox> *local_e8;
  int local_e0;
  int iStack_dc;
  int local_d8;
  BATType local_d4;
  int local_d0;
  int local_cc;
  long *local_c8;
  int local_c0;
  BATType local_bc;
  int local_b8;
  int local_b4;
  long *local_b0;
  int local_a8;
  BATType local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_90;
  BATType local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_78;
  BATType local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  BATOp *local_58;
  undefined4 local_4c;
  BATOp *local_48;
  undefined4 local_3c;
  BATOp *local_38;
  undefined4 local_2c;
  FabArray<amrex::FArrayBox> *local_28;
  undefined4 local_1c;
  FabArray<amrex::FArrayBox> *local_18;
  undefined4 local_c;
  FabArray<amrex::FArrayBox> *local_8;
  
  local_154 = 0;
  local_158 = FabArrayBase::nComp(in_R8);
  uVar2 = 0;
  mfi_00 = (MFIter *)0x0;
  apply(in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
        (int)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
        Homogeneous,(StateMode)in_RDI,in_stack_fffffffffffffce8);
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffcd0 >> 0x38);
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                *)mfi_00,CONCAT44(in_stack_fffffffffffffcac,uVar2));
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                *)mfi_00,CONCAT44(in_stack_fffffffffffffcac,uVar2));
  local_160 = std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                        ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                         mfi_00);
  TilingIfNotGPU();
  MFIter::MFIter(in_RDI,in_stack_fffffffffffffcd8,(bool)do_tiling_);
  while (bVar1 = MFIter::isValid((MFIter *)(local_1e4 + 0x24)), bVar1) {
    this_00 = (FabArray<amrex::FArrayBox> *)local_1e4;
    MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    plVar3 = local_230;
    local_1e4._28_8_ = this_00;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this_00,mfi_00);
    plVar4 = local_278;
    local_1f0 = plVar3;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(this_00,mfi_00);
    plVar3 = local_2c0;
    local_238 = plVar4;
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              ((FabArray<amrex::IArrayBox> *)this_00,mfi_00);
    local_110 = (FabArray<amrex::FArrayBox> *)local_1e4._28_8_;
    local_8 = (FabArray<amrex::FArrayBox> *)local_1e4._28_8_;
    local_c = 0;
    local_104 = *(int *)local_1e4._28_8_;
    local_18 = (FabArray<amrex::FArrayBox> *)local_1e4._28_8_;
    local_1c = 1;
    iStack_100 = *(int *)(local_1e4._28_8_ + 4);
    local_120 = *(int (*) [2])local_1e4._28_8_;
    local_28 = (FabArray<amrex::FArrayBox> *)local_1e4._28_8_;
    local_2c = 2;
    local_118 = (((BoxArray *)(local_1e4._28_8_ + 8))->m_bat).m_bat_type;
    local_e8 = (FabArray<amrex::FArrayBox> *)local_1e4._28_8_;
    local_38 = (BATOp *)(local_1e4._28_8_ + 0xc);
    local_3c = 0;
    in_stack_fffffffffffffd14 = *(int *)local_38;
    local_48 = (BATOp *)(local_1e4._28_8_ + 0xc);
    local_4c = 1;
    iStack_dc = *(int *)(local_1e4._28_8_ + 0x10);
    local_f8 = *(undefined8 *)local_38;
    local_58 = (BATOp *)(local_1e4._28_8_ + 0xc);
    local_5c = 2;
    local_f0 = *(int *)(local_1e4._28_8_ + 0x14);
    for (local_304 = 0; local_308 = local_118, local_304 < local_158; local_304 = local_304 + 1) {
      for (; local_30c = iStack_100, (int)local_308 <= local_f0; local_308 = local_308 + indexType)
      {
        for (; local_310 = local_104, local_30c <= iStack_dc; local_30c = local_30c + 1) {
          for (; local_310 <= in_stack_fffffffffffffd14; local_310 = local_310 + 1) {
            local_cc = local_310;
            local_d0 = local_30c;
            local_d4 = local_308;
            if (*(int *)(*plVar3 +
                        ((long)(local_310 - (int)plVar3[4]) +
                         (long)(local_30c - *(int *)((long)plVar3 + 0x24)) * plVar3[1] +
                        (long)(int)(local_308 - (int)plVar3[5]) * plVar3[2]) * 4) == 0) {
              local_68 = local_238;
              local_6c = local_310;
              local_70 = local_30c;
              local_74 = local_308;
              local_78 = local_304;
              local_98 = local_1f0;
              local_9c = local_310;
              local_a0 = local_30c;
              local_a4 = local_308;
              local_a8 = local_304;
              local_b0 = local_1f0;
              local_b4 = local_310;
              local_b8 = local_30c;
              local_bc = local_308;
              local_c0 = local_304;
              *(double *)
               (*local_1f0 +
               ((long)(local_310 - (int)local_1f0[4]) +
                (long)(local_30c - *(int *)((long)local_1f0 + 0x24)) * local_1f0[1] +
                (long)(int)(local_308 - (int)local_1f0[5]) * local_1f0[2] +
               (long)local_304 * local_1f0[3]) * 8) =
                   *(double *)
                    (*local_238 +
                    ((long)(local_310 - (int)local_238[4]) +
                     (long)(local_30c - *(int *)((long)local_238 + 0x24)) * local_238[1] +
                     (long)(int)(local_308 - (int)local_238[5]) * local_238[2] +
                    (long)local_304 * local_238[3]) * 8) -
                   *(double *)
                    (*local_1f0 +
                    ((long)(local_310 - (int)local_1f0[4]) +
                     (long)(local_30c - *(int *)((long)local_1f0 + 0x24)) * local_1f0[1] +
                     (long)(int)(local_308 - (int)local_1f0[5]) * local_1f0[2] +
                    (long)local_304 * local_1f0[3]) * 8);
            }
            else {
              local_80 = local_1f0;
              local_84 = local_310;
              local_88 = local_30c;
              local_8c = local_308;
              local_90 = local_304;
              *(undefined8 *)
               (*local_1f0 +
               ((long)(local_310 - (int)local_1f0[4]) +
                (long)(local_30c - *(int *)((long)local_1f0 + 0x24)) * local_1f0[1] +
                (long)(int)(local_308 - (int)local_1f0[5]) * local_1f0[2] +
               (long)local_304 * local_1f0[3]) * 8) = 0;
            }
            local_c8 = plVar3;
          }
        }
      }
    }
    local_280 = plVar3;
    local_fc = local_118;
    local_e0 = in_stack_fffffffffffffd14;
    local_d8 = local_f0;
    MFIter::operator++((MFIter *)(local_1e4 + 0x24));
  }
  MFIter::~MFIter(mfi_00);
  return;
}

Assistant:

void
MLNodeLinOp::solutionResidual (int amrlev, MultiFab& resid, MultiFab& x, const MultiFab& b,
                               const MultiFab* /*crse_bcdata*/)
{
    const int mglev = 0;
    const int ncomp = b.nComp();
    apply(amrlev, mglev, resid, x, BCMode::Inhomogeneous, StateMode::Solution);

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][0];
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(resid, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& res = resid.array(mfi);
        Array4<Real const> const& bb = b.const_array(mfi);
        Array4<int const> const& dd = dmsk.const_array(mfi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            if (dd(i,j,k)) {
                res(i,j,k,n) = 0.0;
            } else {
                res(i,j,k,n) = bb(i,j,k,n) - res(i,j,k,n);
            }
        });
    }
}